

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

uint64_t benchmark_index(int files,int file_size)

{
  bool bVar1;
  uint64_t uVar2;
  string *dsname;
  reference ppOVar3;
  set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
  working_snapshots;
  OnDiskDataset *ds;
  const_iterator __end1;
  const_iterator __begin1;
  vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *__range1;
  uint64_t result;
  Database db;
  path ursa_file;
  path test_path;
  int in_stack_00000a18;
  int in_stack_00000a1c;
  path *in_stack_fffffffffffffd28;
  Database *in_stack_fffffffffffffd30;
  Database *this;
  char *in_stack_fffffffffffffd38;
  anon_class_16_2_3082427f *in_stack_fffffffffffffd40;
  OnDiskDataset *local_280;
  OnDiskDataset **local_278;
  __normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
  local_270;
  uint64_t in_stack_fffffffffffffd98;
  undefined8 this_00;
  string local_248 [200];
  string *in_stack_fffffffffffffe80;
  set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
  *in_stack_fffffffffffffea8;
  Database *in_stack_fffffffffffffeb0;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [48];
  v1 local_88 [64];
  path local_48;
  
  produce_test_files_abi_cxx11_(in_stack_00000a1c,in_stack_00000a18);
  std::experimental::filesystem::v1::temp_directory_path_abi_cxx11_(local_88);
  random_hex_string_abi_cxx11_(in_stack_fffffffffffffd98);
  std::operator+(in_stack_fffffffffffffd38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd30);
  std::experimental::filesystem::v1::__cxx11::path::operator/=
            (&in_stack_fffffffffffffd30->db_name,&in_stack_fffffffffffffd28->_M_pathname);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
            (in_stack_fffffffffffffd28);
  Database::create(in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_f8);
  std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
            (in_stack_fffffffffffffd28);
  Database::Database(in_stack_fffffffffffffd30,&in_stack_fffffffffffffd28->_M_pathname);
  std::__cxx11::string::~string(local_248);
  this_00 = local_248 + 0x20;
  uVar2 = benchmark_ms<benchmark_index(int,int)::__0>(in_stack_fffffffffffffd40);
  dsname = (string *)Database::working_sets((Database *)(local_248 + 0x20));
  local_270._M_current =
       (OnDiskDataset **)
       std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::begin
                 ((vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *)
                  in_stack_fffffffffffffd28);
  local_278 = (OnDiskDataset **)
              std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::end
                        ((vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *)
                         in_stack_fffffffffffffd28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffd30,
                       (__normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffd28);
    if (!bVar1) break;
    ppOVar3 = __gnu_cxx::
              __normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
              ::operator*(&local_270);
    local_280 = *ppOVar3;
    OnDiskDataset::get_name_abi_cxx11_(local_280);
    Database::drop_dataset((Database *)this_00,dsname);
    __gnu_cxx::
    __normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
    ::operator++(&local_270);
  }
  this = (Database *)&stack0xfffffffffffffd50;
  std::set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>::
  set((set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_> *
      )0x1136d3);
  Database::collect_garbage(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::experimental::filesystem::v1::remove_all(&local_48);
  std::set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>::
  ~set((set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
        *)0x11370c);
  Database::~Database(this);
  std::experimental::filesystem::v1::__cxx11::path::~path(&this->db_name);
  std::experimental::filesystem::v1::__cxx11::path::~path(&this->db_name);
  return uVar2;
}

Assistant:

uint64_t benchmark_index(int files, int file_size) {
    fs::path test_path = produce_test_files(files, file_size);

    fs::path ursa_file = fs::temp_directory_path();
    ursa_file /= "ursabench_" + random_hex_string(8);

    Database::create(ursa_file);
    Database db(ursa_file);
    uint64_t result = benchmark_ms([&db, &test_path]() {
        auto snap = db.snapshot();
        std::vector<IndexType> index_types = {IndexType::GRAM3};
        Task task = Task(db.allocate_task());
        snap.recursive_index_paths(&task, index_types, {}, {test_path});
        db.commit_task(task.spec(), task.changes());
    });
    for (auto ds : db.working_sets()) {
        db.drop_dataset(ds->get_name());
    }
    std::set<DatabaseSnapshot *> working_snapshots;
    db.collect_garbage(working_snapshots);
    fs::remove_all(test_path);
    return result;
}